

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_finally.cpp
# Opt level: O2

void __thiscall tst_qpromise_finally::rejectedSync_void(tst_qpromise_finally *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar3;
  bool bVar4;
  PromiseData<int> *this_00;
  PromiseData<void> *this_01;
  QPromiseReject<void> *in_R8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_178;
  PromiseResolver<void> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_168;
  _Any_data local_160;
  undefined **local_150;
  PromiseData<void> *local_148;
  QPromiseBase<int> local_140;
  int value;
  QPromiseBase<void> local_128;
  PromiseResolver<int> resolver;
  QPromise<void> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_f0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_e8;
  QPromise<void> p_1;
  function<void_(const_int_&)> local_c8;
  QArrayDataPointer<char16_t> local_a0;
  QPromiseBase<void> local_88;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  value = -1;
  QString::QString((QString *)&local_a0,"foo");
  QtPromise::QPromiseBase<void>::reject<QString>(&local_88,(QString *)&local_a0);
  p_1.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)local_88.m_d;
  if (local_88.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_88.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p_1.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126a88;
  local_140._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126a58;
  this_00 = (PromiseData<int> *)operator_new(0x68);
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(this_00);
  LOCK();
  pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00126b90;
  local_140.m_d.d = this_00;
  local_c8.super__Function_base._M_functor._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_c8);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_c8);
  QVar3 = p_1.super_QPromiseBase<void>.m_d;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_178.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_178 = resolver.m_d.d;
  }
  local_168.d = (Data *)0x0;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_178.d != (Data *)0x0) {
    LOCK();
    ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_160._M_unused._0_8_ = resolver.m_d.d;
  local_160._8_8_ = local_178.d;
  local_150 = (undefined **)&value;
  local_128._vptr_QPromiseBase = (_func_int **)resolver.m_d.d;
  local_58._M_unused._M_object = operator_new(0x18);
  *(void **)local_58._M_unused._0_8_ = local_160._M_unused._M_object;
  if ((Data *)local_160._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_160._M_unused._0_8_ = *local_160._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_160._8_8_;
  if ((Data *)local_160._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_160._8_8_ = *(int *)local_160._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_58._M_unused._0_8_ + 0x10) = local_150;
  pcStack_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseHandler<void,tst_qpromise_finally::rejectedSync_void()::$_0,void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(tst_qpromise_finally::rejectedSync_void()::$_0_const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda()#1}::~function((_lambda___1_ *)local_160._M_pod_data);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (&(QVar3.d)->super_PromiseDataBase<void,_void_()>,(function<void_()> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  QVar3 = p_1.super_QPromiseBase<void>.m_d;
  local_160._M_unused._M_object = local_128._vptr_QPromiseBase;
  if ((Data *)local_128._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_128._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_128._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_160._8_8_ = local_178.d;
  if (local_178.d != (Data *)0x0) {
    LOCK();
    ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_150 = (undefined **)&value;
  local_78._M_unused._M_object = operator_new(0x18);
  *(void **)local_78._M_unused._0_8_ = local_160._M_unused._M_object;
  if ((Data *)local_160._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_160._M_unused._0_8_ = *local_160._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_160._8_8_;
  if ((Data *)local_160._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_160._8_8_ = *(int *)local_160._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_78._M_unused._0_8_ + 0x10) = local_150;
  pcStack_60 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseCatcher<void,tst_qpromise_finally::rejectedSync_void()::$_0,void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(tst_qpromise_finally::rejectedSync_void()::$_0_const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)local_160._M_pod_data);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (&(QVar3.d)->super_PromiseDataBase<void,_void_()>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_178);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_168);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
             &local_128);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
             &resolver_1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_140._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126b90;
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(p_1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              (&(p_1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  }
  local_128.m_d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>)
       p_1.super_QPromiseBase<void>.m_d.d;
  if (p_1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p_1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_128._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126a88;
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126ad0;
  this_01 = (PromiseData<void> *)operator_new(0x58);
  (this_01->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (this_01->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(this_01);
  LOCK();
  pQVar1 = &(this_01->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_01 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(this_01->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_00126a88;
  p.super_QPromiseBase<void>.m_d.d = this_01;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,(QPromise<void> *)&resolver);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&resolver);
  QVar2.d = local_140.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_178.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_178.d = (Data *)resolver_1;
  }
  local_168.d = (Data *)0x0;
  if (local_178.d == (Data *)0x0) {
    local_160._8_8_ = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_160._8_8_ = local_178.d;
  }
  local_f0.d = (Data *)0x0;
  if (local_178.d != (Data *)0x0) {
    LOCK();
    (((Data *)local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_160._8_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_160._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_160._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_148 = local_128.m_d.d;
  if (local_128.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_128.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_150 = &PTR__QPromiseBase_00126a88;
  local_c8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_c8.super__Function_base._M_functor._8_8_ = 0;
  local_c8.super__Function_base._M_manager = (_Manager_type)0x0;
  local_c8._M_invoker = (_Invoker_type)0x0;
  local_160._M_unused._0_8_ = local_178.d;
  local_e8.d = (Data *)local_160._8_8_;
  local_c8.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
  *(void **)local_c8.super__Function_base._M_functor._M_unused._0_8_ = local_160._M_unused._M_object
  ;
  if ((Data *)local_160._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_160._M_unused._0_8_ = *local_160._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_c8.super__Function_base._M_functor._M_unused._0_8_ + 8) =
       local_160._8_8_;
  if ((Data *)local_160._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_160._8_8_ = *(int *)local_160._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_c8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_00126ad0;
  *(PromiseData<void> **)((long)local_c8.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
       local_148;
  if (local_148 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(local_148->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_c8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_00126a88;
  local_c8._M_invoker =
       std::
       _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
       ::_M_invoke;
  local_c8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
       ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<int,QtPromise::QPromiseBase<void>::finally<tst_qpromise_finally::rejectedSync_void()::$_0>(tst_qpromise_finally::rejectedSync_void()::$_0)const::{lambda(int_const&)#1}()#1},void>
  ::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(QtPromise::QPromiseBase<void>::finally<tst_qpromise_finally::rejectedSync_void()::$_0>(tst_qpromise_finally::rejectedSync_void()::$_0)const::{lambda(int_const&)#1}()#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(int_const&)#1}::~function((_lambda_int_const___1_ *)local_160._M_pod_data);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,&local_c8);
  std::_Function_base::~_Function_base(&local_c8.super__Function_base);
  QVar2.d = local_140.m_d.d;
  QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_160,
             (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_178,
             (QPromiseResolve<void> *)&local_e8,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_160);
  std::_Function_base::~_Function_base((_Function_base *)&local_160);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_e8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_f0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_178);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_168);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126a88;
  bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(local_140.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(local_140.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_128);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_140);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p_1.super_QPromiseBase<void>);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  waitForError<QString>((QString *)&local_a0,&p,(QString *)&resolver);
  QString::QString((QString *)&p_1,"foo");
  bVar4 = QTest::qCompare((QString *)&local_a0,(QString *)&p_1,"waitForError(p, QString{})",
                          "QString{\"foo\"}",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                          ,0x8f);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&p_1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&resolver);
  if (bVar4) {
    local_a0.d._0_1_ =
         QtPromisePrivate::PromiseDataBase<void,_void_()>::isRejected
                   (&(p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
    resolver.m_d.d._0_1_ = 1;
    bVar4 = QTest::qCompare<bool,bool>
                      ((bool *)&local_a0,(bool *)&resolver,"p.isRejected()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                       ,0x90);
    if (bVar4) {
      QTest::qCompare(value,8,"value","8",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                      ,0x91);
    }
  }
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p.super_QPromiseBase<void>);
  return;
}

Assistant:

void tst_qpromise_finally::rejectedSync_void()
{
    int value = -1;
    auto p = QtPromise::QPromise<void>::reject(QString{"foo"}).finally([&]() {
        value = 8;
        return 16; // ignored!
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));
    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
    QCOMPARE(p.isRejected(), true);
    QCOMPARE(value, 8);
}